

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_senone.c
# Opt level: O0

void senone_free(senone_t *s)

{
  senone_t *s_local;
  
  if (s != (senone_t *)0x0) {
    if (s->pdf != (senprob_t ***)0x0) {
      ckd_free_3d(s->pdf);
    }
    if (s->mgau != (uint32 *)0x0) {
      ckd_free(s->mgau);
    }
    if (s->featscr != (int32 *)0x0) {
      ckd_free(s->featscr);
    }
    logmath_free(s->lmath);
    ckd_free(s);
  }
  return;
}

Assistant:

void
senone_free(senone_t * s)
{
    if (s == NULL)
        return;
    if (s->pdf)
        ckd_free_3d((void *) s->pdf);
    if (s->mgau)
        ckd_free(s->mgau);
    if (s->featscr)
        ckd_free(s->featscr);
    logmath_free(s->lmath);
    ckd_free(s);
}